

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

void pair1_sock_close(void *arg)

{
  int iVar1;
  bool bVar2;
  nni_msg *local_28;
  nni_msg *m;
  nni_aio *a;
  pair1_sock *s;
  void *arg_local;
  
  a = (nni_aio *)arg;
  s = (pair1_sock *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  while( true ) {
    m = (nni_msg *)nni_list_first((nni_list *)(a->a_iov + 4));
    bVar2 = true;
    if (m == (nni_msg *)0x0) {
      m = (nni_msg *)nni_list_first((nni_list *)((long)&(a->a_task).task_cv.cv + 0x18));
      bVar2 = m != (nni_msg *)0x0;
    }
    if (!bVar2) break;
    nni_aio_list_remove((nni_aio *)m);
    nni_aio_finish_error((nni_aio *)m,NNG_ECLOSED);
  }
  while( true ) {
    iVar1 = nni_lmq_get((nni_lmq *)&(a->a_task).task_cv.mtx,&local_28);
    bVar2 = true;
    if (iVar1 != 0) {
      iVar1 = nni_lmq_get((nni_lmq *)&(a->a_task).task_busy,&local_28);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    nni_msg_free(local_28);
  }
  nni_mtx_unlock((nni_mtx *)&a->a_task);
  return;
}

Assistant:

static void
pair1_sock_close(void *arg)
{
	pair1_sock *s = arg;
	nni_aio    *a;
	nni_msg    *m;
	nni_mtx_lock(&s->mtx);
	while (((a = nni_list_first(&s->raq)) != NULL) ||
	    ((a = nni_list_first(&s->waq)) != NULL)) {
		nni_aio_list_remove(a);
		nni_aio_finish_error(a, NNG_ECLOSED);
	}
	while ((nni_lmq_get(&s->rmq, &m) == 0) ||
	    (nni_lmq_get(&s->wmq, &m) == 0)) {
		nni_msg_free(m);
	}
	nni_mtx_unlock(&s->mtx);
}